

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

WriteThirdPartyDescriptorResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::writeThirdPartyDescriptor
          (WriteThirdPartyDescriptorResult *__return_storage_ptr__,RpcClient *this,
          Connection *provider,Connection *recipient,Builder contact)

{
  undefined8 uVar1;
  Connection *pCVar2;
  uint uVar3;
  RpcConnectionState *pRVar4;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState> params;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef> other;
  OutgoingRpcMessage *pOVar5;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar6;
  Own<capnp::ClientHook,_std::nullptr_t> *other_00;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *other_01;
  VineInfo local_1a8;
  undefined1 local_190 [32];
  Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t>_> local_170;
  Builder local_160;
  SegmentBuilder *local_148;
  CapTableBuilder *pCStack_140;
  WirePointer *local_138;
  uint local_124;
  OnReadyEvent local_120;
  Own<capnp::ClientHook,_std::nullptr_t> *redirect;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_f0;
  undefined1 local_e0 [8];
  OwnOwn<capnp::ClientHook,_std::nullptr_t> _redirect1029;
  BuilderFor<capnp::rpc::Message> local_b8;
  undefined1 local_90 [8];
  Builder provide;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> otherMsg;
  undefined1 local_48 [8];
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> questionRef;
  Question *question;
  undefined8 uStack_28;
  QuestionId questionId;
  Connection *recipient_local;
  Connection *provider_local;
  RpcClient *this_local;
  
  uStack_28 = recipient;
  recipient_local = provider;
  provider_local = (Connection *)this;
  this_local = (RpcClient *)__return_storage_ptr__;
  pRVar4 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     (&this->connectionState);
  questionRef.ptr =
       (QuestionRef *)
       anon_unknown_18::
       ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::nextHigh
                 (&pRVar4->questions,(uint *)((long)&question + 4));
  *(bool *)&(questionRef.ptr)->id = false;
  params = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator*
                     (&this->connectionState);
  kj::
  refcounted<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,capnp::_::RpcSystemBase::RpcConnectionState&,unsigned_int&,kj::None_const&>
            ((kj *)local_48,params,(uint *)((long)&question + 4),(None *)&kj::none);
  other = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
          operator*((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *
                    )local_48);
  kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&>::operator=
            ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&> *)
             &((questionRef.ptr)->connectionState).ptr.ptr,other);
  pCVar2 = recipient_local;
  uVar3 = anon_unknown_18::messageSizeHint<capnp::rpc::Provide>();
  (**pCVar2->_vptr_Connection)(&provide._builder.dataSize,pCVar2,(ulong)(uVar3 + 0x20));
  pOVar5 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                     ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&provide._builder.dataSize);
  (**pOVar5->_vptr_OutgoingRpcMessage)(&_redirect1029.value.ptr);
  AnyPointer::Builder::initAs<capnp::rpc::Message>(&local_b8,(Builder *)&_redirect1029.value.ptr);
  rpc::Message::Builder::initProvide((Builder *)local_90,&local_b8);
  rpc::Provide::Builder::setQuestionId((Builder *)local_90,question._4_4_);
  rpc::Provide::Builder::initTarget((Builder *)&redirect,(Builder *)local_90);
  (*(this->super_ClientHook)._vptr_ClientHook[10])(&local_f0);
  kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>((_ *)local_e0,&local_f0);
  kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe(&local_f0);
  pOVar6 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_e0);
  if (pOVar6 != (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
    local_120.event =
         (Event *)kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::operator*
                            ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_e0);
    other_00 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                         ((Own<capnp::ClientHook,_std::nullptr_t> *)local_120.event);
    kj::
    OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
    ::OneOf<kj::Own<capnp::ClientHook,decltype(nullptr)>,int>
              ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                *)__return_storage_ptr__,other_00);
  }
  local_124 = (uint)(pOVar6 != (Own<capnp::ClientHook,_std::nullptr_t> *)0x0);
  kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_e0);
  pCVar2 = recipient_local;
  uVar1 = uStack_28;
  if (local_124 == 0) {
    local_138 = contact.builder.pointer;
    local_148 = contact.builder.segment;
    pCStack_140 = contact.builder.capTable;
    rpc::Provide::Builder::initRecipient(&local_160,(Builder *)local_90);
    (*(*(_func_int ***)uVar1)[7])(uVar1,pCVar2);
    pOVar5 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                       ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&provide._builder.dataSize
                       );
    (*pOVar5->_vptr_OutgoingRpcMessage[2])();
    (*(this->super_ClientHook)._vptr_ClientHook[4])();
    other_01 = kj::
               mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
                         ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                           *)local_48);
    kj::
    OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
    ::OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,int>
              ((OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
                *)&local_1a8,other_01);
    kj::heap<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo>((kj *)local_190,&local_1a8);
    kj::Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t>_>::
    Maybe(&local_170,
          (Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *)local_190);
    kj::
    OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
    ::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,int>
              ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                *)__return_storage_ptr__,(VineToExport *)(local_190 + 0x10));
    VineToExport::~VineToExport((VineToExport *)(local_190 + 0x10));
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t>::~Own
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *)
               local_190);
    VineInfo::~VineInfo(&local_1a8);
    local_124 = 1;
  }
  kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::~Own
            ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&provide._builder.dataSize);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::~Own
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             local_48);
  return __return_storage_ptr__;
}

Assistant:

virtual WriteThirdPartyDescriptorResult writeThirdPartyDescriptor(
          VatNetworkBase::Connection& provider,
          VatNetworkBase::Connection& recipient,
          AnyPointer::Builder contact) {
      // Called to fill in a ThirdPartyCapDescriptor when sending this capability to a different
      // connection.
      //
      // `provider` is this object's backing connection; the caller has already verified it is
      // currently connected. (Calling connectionState->tryGetConnection() would return the same
      // object.)
      //
      // `recipient` is the connection receiving the ThirdPartyCapDescriptor.
      //
      // `contact` is the ThirdPartyToContact which goes in the descriptor.
      //
      // Returns the ClientHook which should be used as the "vine". This needs to be callable as
      // a stand-in for the object. It also needs to hold open the `Provide` operation until the
      // returned reference is dropped. Note that `addRef()`s on the returned reference do NOT have
      // to hold open the Provide; the Provide can be held open by an attachment on the ref itself.
      //
      // The default implementation of this method is appropriate most of the time. It is
      // overridded for the specific case of `DeferredThirdPartyClient`.

      // Send `Provide` message to our connection.
      QuestionId questionId;
      auto& question = connectionState->questions.nextHigh(questionId);
      question.isAwaitingReturn = false;  // No Return needed
      auto questionRef = kj::refcounted<QuestionRef>(*connectionState, questionId, kj::none);
      question.selfRef = *questionRef;

      auto otherMsg = provider.newOutgoingMessage(messageSizeHint<rpc::Provide>() + 32);
      auto provide = otherMsg->getBody().initAs<rpc::Message>().initProvide();
      provide.setQuestionId(questionId);
      KJ_IF_SOME(redirect, writeTarget(provide.initTarget())) {
        // Oops, this capability was redirected. This *shouldn't* happen since the immediate
        // caller of writeThirdPartyDescriptor() would have already followed redirects, but as it
        // happens, if we simply return the redirect here (without filling in `contact`), we are
        // honoring our contract.
        return kj::mv(redirect);
      }
      recipient.introduceTo(provider, contact, provide.initRecipient());
      otherMsg->send();

      return VineToExport {
        .vine = addRef(),
        .vineInfo = kj::heap(VineInfo { .info = kj::mv(questionRef) })
      };
    }